

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

int __thiscall
kj::CapabilityStreamConnectionReceiver::accept
          (CapabilityStreamConnectionReceiver *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  _func_int *p_Var1;
  void *pvVar2;
  TransformPromiseNodeBase *this_00;
  AsyncCapabilityStream local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  AsyncCapabilityStream::receiveStream(&local_38);
  p_Var1 = local_38.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1];
  if (p_Var1 == (_func_int *)0x0 ||
      (ulong)((long)local_38.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream -
             (long)p_Var1) < 0x28) {
    pvVar2 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar2 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_38,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2765:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar2 + 0x3d8) = &PTR_destroy_00676e90;
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    local_38.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1] = (_func_int *)0x0
    ;
    this_00 = (TransformPromiseNodeBase *)
              (local_38.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_38,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2765:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    local_38.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[-5] =
         (_func_int *)&PTR_destroy_00676e90;
    local_38.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[-4] = p_Var1;
  }
  local_38.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream = (_func_int **)0x0;
  (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = (_func_int **)this_00;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
             &local_38.super_AsyncIoStream.super_AsyncOutputStream);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_38);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> CapabilityStreamConnectionReceiver::accept() {
  return inner.receiveStream()
      .then([](Own<AsyncCapabilityStream>&& stream) -> Own<AsyncIoStream> {
    return kj::mv(stream);
  });
}